

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::AssertSnapEquiv_SnapSetInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapSetInfo *pSVar1;
  SnapSetInfo *pSVar2;
  uint local_34;
  uint32 i;
  SnapSetInfo *setInfo2;
  SnapSetInfo *setInfo1;
  TTDCompareMap *compareMap_local;
  SnapObject *sobj2_local;
  SnapObject *sobj1_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
                     (sobj1);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
                     (sobj2);
  TTDCompareMap::DiagnosticAssert(compareMap,pSVar1->SetSize == pSVar2->SetSize);
  if (sobj1->SnapType->JsTypeId == TypeIds_Set) {
    for (local_34 = 0; local_34 < pSVar1->SetSize; local_34 = local_34 + 1) {
      NSSnapValues::AssertSnapEquivTTDVar_SpecialArray
                (pSVar1->SetValueArray[local_34],pSVar2->SetValueArray[local_34],compareMap,
                 L"setValues",local_34);
    }
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapSetInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapSetInfo* setInfo1 = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(sobj1);
            const SnapSetInfo* setInfo2 = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(sobj2);

            compareMap.DiagnosticAssert(setInfo1->SetSize == setInfo2->SetSize);

            //Treat weak set contents as ignorable
            if(sobj1->SnapType->JsTypeId == Js::TypeIds_Set)
            {
                for(uint32 i = 0; i < setInfo1->SetSize; ++i)
                {
                    NSSnapValues::AssertSnapEquivTTDVar_SpecialArray(setInfo1->SetValueArray[i], setInfo2->SetValueArray[i], compareMap, _u("setValues"), i);
                }
            }
        }